

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.hpp
# Opt level: O2

string * __thiscall
antlr::CommonToken::getText_abi_cxx11_(string *__return_storage_ptr__,CommonToken *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->text);
  return __return_storage_ptr__;
}

Assistant:

string getText() const
	{
		return text;
	}